

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32_stage5_sse4_1
               (__m128i *bf1,__m128i *cospim16,__m128i *cospi48,__m128i *cospi16,__m128i *cospim48,
               __m128i *clamp_lo,__m128i *clamp_hi,__m128i *rounding,int bit)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  longlong in_R9;
  __m128i *out1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  __m128i *extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i *extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i temp2;
  __m128i temp1;
  __m128i *clamp_lo_00;
  __m128i *clamp_hi_00;
  
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x90),in_RDX,(__m128i *)(in_RDI + 0xe0),
                  (__m128i *)temp1[0],(uint)temp1[1]);
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x90),in_RCX,(__m128i *)(in_RDI + 0xe0),
                  (__m128i *)temp1[0],(uint)temp1[1]);
  *(undefined8 *)(in_RDI + 0xe0) = extraout_XMM0_Qa_00;
  *(undefined8 *)(in_RDI + 0xe8) = extraout_XMM0_Qb_00;
  *(undefined8 *)(in_RDI + 0x90) = extraout_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x98) = extraout_XMM0_Qb;
  half_btf_sse4_1(in_R8,(__m128i *)(in_RDI + 0xa0),in_RSI,(__m128i *)(in_RDI + 0xd0),
                  (__m128i *)temp1[0],(uint)temp1[1]);
  out1 = (__m128i *)(ulong)(uint)temp1[1];
  clamp_lo_00 = extraout_XMM0_Qa_01;
  clamp_hi_00 = extraout_XMM0_Qb_01;
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0xa0),in_RDX,(__m128i *)(in_RDI + 0xd0),
                  (__m128i *)temp1[0],(uint)temp1[1]);
  *(undefined8 *)(in_RDI + 0xd0) = extraout_XMM0_Qa_02;
  *(undefined8 *)(in_RDI + 0xd8) = extraout_XMM0_Qb_02;
  *(__m128i **)(in_RDI + 0xa0) = clamp_lo_00;
  *(__m128i **)(in_RDI + 0xa8) = clamp_hi_00;
  in0[0] = in_RDI + 0x100;
  in0[1] = in_RDI + 0x130;
  in1[1] = temp2[1];
  in1[0] = in_R9;
  addsub_sse4_1(in0,in1,(__m128i *)temp1[0],out1,clamp_lo_00,clamp_hi_00);
  in0_00[0] = in_RDI + 0x110;
  in0_00[1] = in_RDI + 0x120;
  in1_00[1] = temp2[1];
  in1_00[0] = in_R9;
  addsub_sse4_1(in0_00,in1_00,(__m128i *)temp1[0],out1,clamp_lo_00,clamp_hi_00);
  in0_01[0] = in_RDI + 0x170;
  in0_01[1] = in_RDI + 0x140;
  in1_01[1] = temp2[1];
  in1_01[0] = in_R9;
  addsub_sse4_1(in0_01,in1_01,(__m128i *)temp1[0],out1,clamp_lo_00,clamp_hi_00);
  in0_02[0] = in_RDI + 0x160;
  in0_02[1] = in_RDI + 0x150;
  in1_02[1] = temp2[1];
  in1_02[0] = in_R9;
  addsub_sse4_1(in0_02,in1_02,(__m128i *)temp1[0],out1,clamp_lo_00,clamp_hi_00);
  in0_03[0] = in_RDI + 0x180;
  in0_03[1] = in_RDI + 0x1b0;
  in1_03[1] = temp2[1];
  in1_03[0] = in_R9;
  addsub_sse4_1(in0_03,in1_03,(__m128i *)temp1[0],out1,clamp_lo_00,clamp_hi_00);
  in0_04[0] = in_RDI + 400;
  in0_04[1] = in_RDI + 0x1a0;
  in1_04[1] = temp2[1];
  in1_04[0] = in_R9;
  addsub_sse4_1(in0_04,in1_04,(__m128i *)temp1[0],out1,clamp_lo_00,clamp_hi_00);
  in0_05[0] = in_RDI + 0x1f0;
  in0_05[1] = in_RDI + 0x1c0;
  in1_05[1] = temp2[1];
  in1_05[0] = in_R9;
  addsub_sse4_1(in0_05,in1_05,(__m128i *)temp1[0],out1,clamp_lo_00,clamp_hi_00);
  in0_06[0] = in_RDI + 0x1e0;
  in0_06[1] = in_RDI + 0x1d0;
  in1_06[1] = temp2[1];
  in1_06[0] = in_R9;
  addsub_sse4_1(in0_06,in1_06,(__m128i *)temp1[0],out1,clamp_lo_00,clamp_hi_00);
  return;
}

Assistant:

static inline void idct32_stage5_sse4_1(
    __m128i *bf1, const __m128i *cospim16, const __m128i *cospi48,
    const __m128i *cospi16, const __m128i *cospim48, const __m128i *clamp_lo,
    const __m128i *clamp_hi, const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  temp1 = half_btf_sse4_1(cospim16, &bf1[9], cospi48, &bf1[14], rounding, bit);
  bf1[14] = half_btf_sse4_1(cospi48, &bf1[9], cospi16, &bf1[14], rounding, bit);
  bf1[9] = temp1;

  temp2 =
      half_btf_sse4_1(cospim48, &bf1[10], cospim16, &bf1[13], rounding, bit);
  bf1[13] =
      half_btf_sse4_1(cospim16, &bf1[10], cospi48, &bf1[13], rounding, bit);
  bf1[10] = temp2;

  addsub_sse4_1(bf1[16], bf1[19], bf1 + 16, bf1 + 19, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[17], bf1[18], bf1 + 17, bf1 + 18, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[23], bf1[20], bf1 + 23, bf1 + 20, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[22], bf1[21], bf1 + 22, bf1 + 21, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[24], bf1[27], bf1 + 24, bf1 + 27, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[25], bf1[26], bf1 + 25, bf1 + 26, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[31], bf1[28], bf1 + 31, bf1 + 28, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[30], bf1[29], bf1 + 30, bf1 + 29, clamp_lo, clamp_hi);
}